

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

void __thiscall
jwt::verifier<jwt::default_clock>::algo<jwt::algorithm::rs256>::algo
          (algo<jwt::algorithm::rs256> *this,rs256 *a)

{
  rs256 *a_local;
  algo<jwt::algorithm::rs256> *this_local;
  
  algo_base::algo_base(&this->super_algo_base);
  (this->super_algo_base)._vptr_algo_base = (_func_int **)&PTR__algo_0012ac00;
  algorithm::rs256::rs256(&this->alg,a);
  return;
}

Assistant:

explicit algo(T a) : alg(a) {}